

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalMapping::set_allocated_stringtoint64map
          (CategoricalMapping *this,StringToInt64Map *stringtoint64map)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_MappingType(this);
  if (stringtoint64map != (StringToInt64Map *)0x0) {
    submessage_arena = (Arena *)(stringtoint64map->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      stringtoint64map =
           (StringToInt64Map *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&stringtoint64map->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 1;
    (this->MappingType_).stringtoint64map_ = stringtoint64map;
  }
  return;
}

Assistant:

void CategoricalMapping::set_allocated_stringtoint64map(::CoreML::Specification::StringToInt64Map* stringtoint64map) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_MappingType();
  if (stringtoint64map) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(stringtoint64map));
    if (message_arena != submessage_arena) {
      stringtoint64map = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, stringtoint64map, submessage_arena);
    }
    set_has_stringtoint64map();
    MappingType_.stringtoint64map_ = stringtoint64map;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CategoricalMapping.stringToInt64Map)
}